

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeStore
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,Type type,int bytes,bool isAtomic,Name *mem,Memarg memarg)

{
  undefined8 *puVar1;
  _Copy_ctor_base<false,_wasm::Name,_wasm::Err> *p_Var2;
  _Variant_storage<false,_wasm::Ok,_wasm::Err> *this_00;
  _Variant_storage<false,_wasm::Ok,_wasm::Err> local_100;
  _Variant_storage<false,_wasm::Ok,_wasm::Err> local_d8;
  undefined1 auStack_b0 [8];
  Result<wasm::Name> m;
  Result<wasm::Name> _val;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  undefined8 uStack_48;
  Type local_40;
  uint local_34;
  
  local_34 = bytes;
  getMemory((Result<wasm::Name> *)auStack_b0,this,pos,mem);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)
             ((long)&m.val.super__Variant_base<wasm::Name,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),
             (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)auStack_b0);
  if (_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::Err>.super__Move_ctor_alias<wasm::Name,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\x01') {
    _val.val.super__Variant_base<wasm::Name,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::Err>.super__Copy_assign_alias<wasm::Name,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_ = &local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),
               m.val.super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
               super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_,
               _val.val.super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
               super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._M_first._M_storage.
               super_IString.str._M_len +
               m.val.super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
               super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
    if ((undefined1 *)
        _val.val.super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_ == &local_50) {
      *puVar1 = CONCAT71(uStack_4f,local_50);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_48;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
           _val.val.super__Variant_base<wasm::Name,_wasm::Err>.
           super__Move_assign_alias<wasm::Name,_wasm::Err>.
           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
           super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           CONCAT71(uStack_4f,local_50);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_58;
    local_50 = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    _val.val.super__Variant_base<wasm::Name,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::Err>.super__Copy_assign_alias<wasm::Name,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_ = &local_50;
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)
               ((long)&m.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
  }
  else {
    local_40.id = type.id;
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)
               ((long)&m.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
    if (isAtomic) {
      p_Var2 = (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)0x0;
      if (m.val.super__Variant_base<wasm::Name,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\0') {
        p_Var2 = (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)auStack_b0;
      }
      IRBuilder::makeAtomicStore
                ((Result<wasm::Ok> *)&local_100,&this->irBuilder,local_34,(Address)memarg.offset,
                 local_40,(Name)(p_Var2->super__Variant_storage_alias<wasm::Name,_wasm::Err>)._M_u.
                                _M_first._M_storage.super_IString.str);
      withLoc<wasm::Ok>(__return_storage_ptr__,this,pos,(Result<wasm::Ok> *)&local_100);
      this_00 = &local_100;
    }
    else {
      p_Var2 = (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)0x0;
      if (m.val.super__Variant_base<wasm::Name,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\0') {
        p_Var2 = (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)auStack_b0;
      }
      IRBuilder::makeStore
                ((Result<wasm::Ok> *)&local_d8,&this->irBuilder,local_34,(Address)memarg.offset,
                 memarg.align,local_40,
                 (Name)(p_Var2->super__Variant_storage_alias<wasm::Name,_wasm::Err>)._M_u._M_first.
                       _M_storage.super_IString.str);
      withLoc<wasm::Ok>(__return_storage_ptr__,this,pos,(Result<wasm::Ok> *)&local_d8);
      this_00 = &local_d8;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              (this_00);
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)auStack_b0);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeStore(Index pos,
                     const std::vector<Annotation>& annotations,
                     Type type,
                     int bytes,
                     bool isAtomic,
                     Name* mem,
                     Memarg memarg) {
    auto m = getMemory(pos, mem);
    CHECK_ERR(m);
    if (isAtomic) {
      return withLoc(pos,
                     irBuilder.makeAtomicStore(bytes, memarg.offset, type, *m));
    }
    return withLoc(
      pos, irBuilder.makeStore(bytes, memarg.offset, memarg.align, type, *m));
  }